

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int parseAndSaveValueTree
              (string *input,string *actual,string *kind,Features *features,bool parseOnly,
              Value *root)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char *__filename;
  FILE *__stream;
  byte in_R8B;
  Reader *in_R9;
  FILE *factual;
  string *in_stack_00000090;
  Value *in_stack_00000098;
  bool parsingSuccessful;
  Reader reader;
  Reader *in_stack_fffffffffffffe20;
  Features *in_stack_fffffffffffffe38;
  Reader *this;
  undefined6 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4e;
  allocator in_stack_fffffffffffffe4f;
  Reader *in_stack_fffffffffffffe50;
  string local_180 [55];
  undefined1 local_149;
  Reader *in_stack_ffffffffffffff88;
  int local_4;
  
  this = (Reader *)&stack0xfffffffffffffeb8;
  Json::Reader::Reader(this,in_stack_fffffffffffffe38);
  local_149 = Json::Reader::parse(in_stack_fffffffffffffe50,
                                  (string *)
                                  CONCAT17(in_stack_fffffffffffffe4f,
                                           CONCAT16(in_stack_fffffffffffffe4e,
                                                    in_stack_fffffffffffffe48)),(Value *)this,
                                  SUB81((ulong)in_stack_fffffffffffffe38 >> 0x38,0));
  if ((bool)local_149) {
    if ((in_R8B & 1) == 0) {
      __filename = (char *)std::__cxx11::string::c_str();
      __stream = fopen(__filename,"wt");
      if (__stream == (FILE *)0x0) {
        uVar1 = std::__cxx11::string::c_str();
        printf("Failed to create %s actual file.\n",uVar1);
        local_4 = 2;
        goto LAB_00129dcd;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffe50,".",(allocator *)&stack0xfffffffffffffe4f);
      printValueTree((FILE *)reader.nodes_.c.
                             super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                             _M_impl.super__Deque_impl_data._M_map,in_stack_00000098,
                     in_stack_00000090);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe50);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe4f);
      fclose(__stream);
      in_stack_fffffffffffffe20 = in_R9;
    }
    local_4 = 0;
  }
  else {
    uVar1 = std::__cxx11::string::c_str();
    Json::Reader::getFormattedErrorMessages_abi_cxx11_(in_stack_ffffffffffffff88);
    uVar2 = std::__cxx11::string::c_str();
    printf("Failed to parse %s file: \n%s\n",uVar1,uVar2);
    std::__cxx11::string::~string(local_180);
    local_4 = 1;
  }
LAB_00129dcd:
  Json::Reader::~Reader(in_stack_fffffffffffffe20);
  return local_4;
}

Assistant:

static int parseAndSaveValueTree(const std::string& input,
                                 const std::string& actual,
                                 const std::string& kind,
                                 const Json::Features& features,
                                 bool parseOnly,
                                 Json::Value* root)
{
  Json::Reader reader(features);
  bool parsingSuccessful = reader.parse(input, *root);
  if (!parsingSuccessful) {
    printf("Failed to parse %s file: \n%s\n",
           kind.c_str(),
           reader.getFormattedErrorMessages().c_str());
    return 1;
  }
  if (!parseOnly) {
    FILE* factual = fopen(actual.c_str(), "wt");
    if (!factual) {
      printf("Failed to create %s actual file.\n", kind.c_str());
      return 2;
    }
    printValueTree(factual, *root);
    fclose(factual);
  }
  return 0;
}